

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O0

void __thiscall OpenMD::MoleculeStamp::MoleculeStamp(MoleculeStamp *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_bool>
  pVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  string *in_stack_fffffffffffffb88;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  value_type *in_stack_fffffffffffffb98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *in_stack_fffffffffffffba0;
  value_type *in_stack_fffffffffffffba8;
  value_type *__x;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  allocator<char> *in_stack_fffffffffffffbc0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffbc8;
  allocator<char> *__s;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  undefined1 local_2a9 [33];
  _Base_ptr local_288;
  undefined1 local_280;
  allocator<char> local_271;
  string local_270 [32];
  _Base_ptr local_250;
  undefined1 local_248;
  allocator<char> local_239;
  string local_238 [32];
  _Base_ptr local_218;
  undefined1 local_210;
  allocator<char> local_201;
  string local_200 [32];
  _Base_ptr local_1e0;
  undefined1 local_1d8;
  allocator<char> local_1c9;
  string local_1c8 [32];
  _Base_ptr local_1a8;
  undefined1 local_1a0;
  allocator<char> local_191;
  string local_190 [32];
  _Base_ptr local_170;
  undefined1 local_168;
  allocator<char> local_159;
  string local_158 [32];
  _Base_ptr local_138;
  undefined1 local_130;
  undefined8 *local_128;
  allocator<char> local_119;
  string local_118 [79];
  allocator<char> local_c9;
  string local_c8 [32];
  _Base_ptr local_a8;
  undefined1 local_a0;
  undefined8 *local_98;
  allocator<char> local_89;
  string local_88 [79];
  allocator<char> local_39;
  string local_38 [56];
  
  DataHolder::DataHolder
            ((DataHolder *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  *in_RDI = &PTR__MoleculeStamp_004ea0b8;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  Parameter<bool>::Parameter
            ((Parameter<bool> *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::vector
            ((vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *)0x382b43);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x382b5f);
  std::vector<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>::vector
            ((vector<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_> *)0x382b7b);
  std::vector<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>::vector
            ((vector<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_> *)0x382b97);
  std::vector<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>::vector
            ((vector<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_> *)0x382bb3);
  std::vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>::vector
            ((vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_> *)0x382bcf
            );
  std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::vector
            ((vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_> *)0x382beb
            );
  std::vector<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>::vector
            ((vector<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_> *)
             0x382c07);
  std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::vector
            ((vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_> *)0x382c23);
  std::vector<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>::vector
            ((vector<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_> *)
             0x382c3f);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x382c5b);
  *(undefined4 *)(in_RDI + 0x3e) = 0;
  *(undefined4 *)(in_RDI + 0x3f) = 0xffffffff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),in_stack_fffffffffffffbc8
             ,in_stack_fffffffffffffbc0);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
             in_stack_fffffffffffffb88);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),in_stack_fffffffffffffbc8
             ,in_stack_fffffffffffffbc0);
  local_98 = in_RDI + 0xd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffffba0,&in_stack_fffffffffffffb98->first,
             (ParameterBase **)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  pVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_a8 = (_Base_ptr)pVar3.first._M_node;
  local_a0 = pVar3.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x382db2);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),in_stack_fffffffffffffbc8
             ,in_stack_fffffffffffffbc0);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
             in_stack_fffffffffffffb88);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x17),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),in_stack_fffffffffffffbc8
             ,in_stack_fffffffffffffbc0);
  local_128 = in_RDI + 0x17;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffffba0,&in_stack_fffffffffffffb98->first,
             (ParameterBase **)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  pVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_138 = (_Base_ptr)pVar3.first._M_node;
  local_130 = pVar3.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x382f2e);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),in_stack_fffffffffffffbc8
             ,in_stack_fffffffffffffbc0);
  pVar4 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                   in_stack_fffffffffffffba8);
  local_170 = (_Base_ptr)pVar4.first._M_node;
  local_168 = pVar4.second;
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),in_stack_fffffffffffffbc8
             ,in_stack_fffffffffffffbc0);
  pVar4 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                   in_stack_fffffffffffffba8);
  local_1a8 = (_Base_ptr)pVar4.first._M_node;
  local_1a0 = pVar4.second;
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),in_stack_fffffffffffffbc8
             ,in_stack_fffffffffffffbc0);
  pVar4 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                   in_stack_fffffffffffffba8);
  local_1e0 = (_Base_ptr)pVar4.first._M_node;
  local_1d8 = pVar4.second;
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),in_stack_fffffffffffffbc8
             ,in_stack_fffffffffffffbc0);
  pVar4 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                   in_stack_fffffffffffffba8);
  local_218 = (_Base_ptr)pVar4.first._M_node;
  local_210 = pVar4.second;
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),in_stack_fffffffffffffbc8
             ,in_stack_fffffffffffffbc0);
  pVar4 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                   in_stack_fffffffffffffba8);
  local_250 = (_Base_ptr)pVar4.first._M_node;
  uVar1 = pVar4.second;
  local_248 = uVar1;
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  __a = (allocator<char> *)(in_RDI + 7);
  __s = &local_271;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffbd0),(char *)__s,__a);
  pVar4 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                   in_stack_fffffffffffffba8);
  local_288 = (_Base_ptr)pVar4.first._M_node;
  uVar2 = pVar4.second;
  local_280 = uVar2;
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  __x = (value_type *)local_2a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffbd0),(char *)__s,__a);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT17(uVar2,in_stack_fffffffffffffbb0),__x);
  std::__cxx11::string::~string((string *)(local_2a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2a9);
  return;
}

Assistant:

MoleculeStamp::MoleculeStamp() : nintegrable_(0), ident_ {-1} {
    DefineParameter(Name, "name");
    DefineOptionalParameter(ConstrainTotalCharge, "constrainTotalCharge");

    deprecatedKeywords_.insert("nAtoms");
    deprecatedKeywords_.insert("nBonds");
    deprecatedKeywords_.insert("nBends");
    deprecatedKeywords_.insert("nTorsions");
    deprecatedKeywords_.insert("nInversions");
    deprecatedKeywords_.insert("nRigidBodies");
    deprecatedKeywords_.insert("nCutoffGroups");
  }